

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

int setbf(match *res,bitfield *bf,ull num)

{
  int len;
  ull uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = num - bf->addend ^ bf->xorend;
  len = bf->sbf[0].len;
  uVar6 = uVar5;
  if (bf->lut != (ull *)0x0) {
    iVar2 = bf->sbf[1].len + len;
    uVar4 = 1 << ((byte)iVar2 & 0x1f);
    if (iVar2 == 0x1f) {
      uVar6 = 0;
    }
    else {
      uVar6 = 1;
      if (1 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      uVar3 = 0;
      do {
        if (bf->lut[uVar3] == uVar5) {
          uVar6 = uVar3 & 0xffffffff;
          break;
        }
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
      if ((uint)uVar6 == uVar4) {
        return 0;
      }
    }
  }
  uVar6 = uVar6 >> ((byte)bf->shr & 0x3f);
  setsbf(res,bf->sbf[0].pos,len,uVar6);
  setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,uVar6 >> ((byte)bf->sbf[0].len & 0x3f));
  uVar1 = getbf_as(bf,res->a,res->m);
  return (uint)(uVar1 == num);
}

Assistant:

static int setbf (struct match *res, const struct bitfield *bf, ull num) {
	ull onum = num;
	num = (num - bf->addend) ^ bf->xorend;
	if (bf->lut) {
		int max = 1 << (bf->sbf[0].len + bf->sbf[1].len);
		int j = 0;
		for (j = 0; j < max; j++)
			if (bf->lut[j] == num)
				break;
		if (j == max)
			return 0;
		num = j;
	}
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	return (getbf_as(bf, res->a, res->m) & mask) == (onum & mask);
}